

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> * __thiscall
MXNetNode::weight(vector<float,_std::allocator<float>_> *__return_storage_ptr__,MXNetNode *this,
                 int i,int init_len)

{
  pointer piVar1;
  pointer pMVar2;
  pointer pMVar3;
  size_t __n;
  int iVar4;
  int iVar5;
  ulong in_RAX;
  uint uVar6;
  ulong uVar7;
  vector<float,_std::allocator<float>_> *__x;
  string *psVar8;
  undefined8 local_38;
  
  if ((-1 < i) &&
     (piVar1 = (this->weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     i < (int)((ulong)((long)(this->weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar1) >> 2))) {
    pMVar2 = (this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (int)((long)(this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 3) * -0x45d1745d
    ;
    if (0 < (int)uVar6) {
      iVar5 = piVar1[(uint)i];
      pMVar3 = (this->nodes->super__Vector_base<MXNetNode,_std::allocator<MXNetNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __n = pMVar3[iVar5].name._M_string_length;
      uVar7 = (ulong)(uVar6 & 0x7fffffff);
      __x = &pMVar2->data;
      local_38 = in_RAX;
      do {
        if ((*(size_t *)(__x + -1) == __n) &&
           ((__n == 0 ||
            (iVar4 = bcmp(*(void **)((long)(__x + -2) + 0x10),pMVar3[iVar5].name._M_dataplus._M_p,
                          __n), iVar4 == 0)))) {
          if ((__x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start !=
              *(pointer *)
               ((long)&(__x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data + 8)) {
            std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,__x);
            return __return_storage_ptr__;
          }
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (init_len == 0) {
            return __return_storage_ptr__;
          }
          if (((string *)(__x + 1))->_M_string_length == 0) {
            return __return_storage_ptr__;
          }
          psVar8 = (string *)(__x + 1);
          iVar5 = std::__cxx11::string::compare((char *)psVar8);
          if (((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)psVar8), iVar5 != 0))
             && (iVar5 = std::__cxx11::string::compare((char *)psVar8), iVar5 != 0)) {
            iVar5 = std::__cxx11::string::compare((char *)psVar8);
            if (((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)psVar8), iVar5 != 0)
                ) && (iVar5 = std::__cxx11::string::compare((char *)psVar8), iVar5 != 0)) {
              return __return_storage_ptr__;
            }
            local_38 = CONCAT44(local_38._4_4_,0x3f800000);
            std::vector<float,_std::allocator<float>_>::resize
                      (__return_storage_ptr__,(long)init_len,(value_type_conflict2 *)&local_38);
            return __return_storage_ptr__;
          }
          local_38 = local_38 & 0xffffffff;
          std::vector<float,_std::allocator<float>_>::resize
                    (__return_storage_ptr__,(long)init_len,
                     (value_type_conflict2 *)((long)&local_38 + 4));
          return __return_storage_ptr__;
        }
        __x = (vector<float,_std::allocator<float>_> *)((long)(__x + 3) + 0x10);
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
  }
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> MXNetNode::weight(int i, int init_len) const
{
    if (i < 0 || i >= (int)weights.size())
        return std::vector<float>();

    const std::string& node_name = (*nodes)[weights[i]].name;

    for (int j = 0; j < (int)(*params).size(); j++)
    {
        const MXNetParam& p = (*params)[j];
        if (p.name != node_name)
            continue;

        if (!p.data.empty())
            return p.data;

        std::vector<float> data;

        if (!p.init.empty() && init_len != 0)
        {
            if (p.init == "[\\$zero\\$, {}]" || p.init == "[\\\"zero\\\", {}]" || p.init == "zeros")
            {
                data.resize(init_len, 0.f);
            }
            else if (p.init == "[\\$one\\$, {}]" || p.init == "[\\\"one\\\", {}]" || p.init == "ones")
            {
                data.resize(init_len, 1.f);
            }
        }

        return data;
    }

    return std::vector<float>();
}